

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
dnet::data_types::tensor<int,_1U>::tensor
          (tensor<int,_1U> *this,type *data,array<unsigned_int,_1UL> size)

{
  vector<int,_std::allocator<int>_> local_58;
  output_type local_40;
  _Type local_24;
  type *local_20;
  type *data_local;
  tensor<int,_1U> *this_local;
  array<unsigned_int,_1UL> size_local;
  
  local_24[0] = size._M_elems[0];
  local_20 = data;
  data_local = &this->_data;
  this_local._4_4_ = size._M_elems[0];
  tensor(this,size);
  std::vector<int,_std::allocator<int>_>::vector(&local_58,data);
  vec_flater<int,_1U>::flatten(&local_40,&local_58);
  std::vector<int,_std::allocator<int>_>::operator=(&this->_data,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_58);
  return;
}

Assistant:

tensor<T, N>::tensor(typename vector_dim<T, N>::type data, std::array<index_type, N> size)
                : tensor(size)
        {
            this->_data = vec_flater<T, N>::flatten(data);
        }